

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O2

void __thiscall
KosarajuSCC::topological_sort
          (KosarajuSCC *this,int u,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *out,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *ends,queue<int,_std::deque<int,_std::allocator<int>_>_> *sort,
          vector<bool,_std::allocator<bool>_> *seen)

{
  int u_00;
  pointer pvVar1;
  long lVar2;
  uint uVar3;
  size_type __n;
  reference rVar4;
  int local_44;
  queue<int,_std::deque<int,_std::allocator<int>_>_> *local_40;
  KosarajuSCC *local_38;
  
  __n = (size_type)u;
  local_44 = u;
  local_40 = sort;
  local_38 = this;
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](seen,__n);
  *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
  uVar3 = 0;
  while( true ) {
    pvVar1 = (out->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar2 = *(long *)&pvVar1[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    if ((ulong)((long)*(pointer *)
                       ((long)&pvVar1[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + 8) - lVar2 >> 2) <= (ulong)uVar3) break;
    u_00 = *(int *)(*(long *)&(ends->
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start
                              [*(int *)(lVar2 + (ulong)uVar3 * 4)].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + 4);
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](seen,(long)u_00);
    if ((*rVar4._M_p & rVar4._M_mask) == 0) {
      topological_sort(local_38,u_00,out,ends,local_40,seen);
    }
    uVar3 = uVar3 + 1;
  }
  std::deque<int,_std::allocator<int>_>::push_back(&local_40->c,&local_44);
  return;
}

Assistant:

void KosarajuSCC::topological_sort(int u, std::vector<std::vector<int> >& out,
																	 std::vector<std::vector<int> >& ends, std::queue<int>& sort,
																	 std::vector<bool>& seen) {
	seen[u] = true;
	for (unsigned int i = 0; i < out[u].size(); ++i) {
		const int e = out[u][i];
		const int v = ends[e][1];
		if (!seen[v]) {
			topological_sort(v, out, ends, sort, seen);
		}
	}
	sort.push(u);
}